

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int update_remote_initial_window_size_func(void *entry,void *ptr)

{
  int iVar1;
  
  iVar1 = nghttp2_stream_update_remote_initial_window_size
                    ((nghttp2_stream *)entry,*(int32_t *)((long)ptr + 8),
                     *(int32_t *)((long)ptr + 0xc));
  if (iVar1 != 0) {
    iVar1 = nghttp2_session_add_rst_stream(*ptr,*(int32_t *)((long)entry + 0xa8),3);
    return iVar1;
  }
  if (((0 < *(int *)((long)entry + 0xac)) &&
      (iVar1 = nghttp2_stream_check_deferred_by_flow_control((nghttp2_stream *)entry), iVar1 != 0))
     && (iVar1 = session_resume_deferred_stream_item(*ptr,(nghttp2_stream *)entry,'\x04'),
        iVar1 < -900)) {
    return iVar1;
  }
  return 0;
}

Assistant:

static int update_remote_initial_window_size_func(void *entry, void *ptr) {
  int rv;
  nghttp2_update_window_size_arg *arg;
  nghttp2_stream *stream;

  arg = (nghttp2_update_window_size_arg *)ptr;
  stream = (nghttp2_stream *)entry;

  rv = nghttp2_stream_update_remote_initial_window_size(
    stream, arg->new_window_size, arg->old_window_size);
  if (rv != 0) {
    return nghttp2_session_add_rst_stream(arg->session, stream->stream_id,
                                          NGHTTP2_FLOW_CONTROL_ERROR);
  }

  /* If window size gets positive, push deferred DATA frame to
     outbound queue. */
  if (stream->remote_window_size > 0 &&
      nghttp2_stream_check_deferred_by_flow_control(stream)) {
    rv = session_resume_deferred_stream_item(
      arg->session, stream, NGHTTP2_STREAM_FLAG_DEFERRED_FLOW_CONTROL);

    if (nghttp2_is_fatal(rv)) {
      return rv;
    }
  }
  return 0;
}